

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

void embree::sse42::InstanceArrayIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  int iVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  long *plVar8;
  long lVar9;
  _func_int *p_Var10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  undefined1 in_XMM0 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  float fVar20;
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [16];
  vfloat4 l02;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  float fVar32;
  undefined1 auVar33 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 in_XMM7 [16];
  vfloat4 a0;
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 in_XMM11 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 in_XMM12 [16];
  float fVar52;
  float fVar53;
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 auVar23 [16];
  
  auVar33 = in_XMM5._0_12_;
  uVar4 = prim->primID_;
  pGVar6 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var10 = *(_func_int **)&pGVar6->field_0x58;
  if ((((p_Var10 != (_func_int *)0x0) ||
       ((uVar11 = (ulong)*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                                  (long)pGVar6[1].intersectionFilterN * (ulong)uVar4),
        uVar11 != 0xffffffff &&
        (p_Var10 = pGVar6[1].super_RefCount._vptr_RefCount[uVar11], p_Var10 != (_func_int *)0x0))))
      && (((ray->super_RayK<1>).mask & pGVar6->mask) != 0)) &&
     (pRVar7 = context->user, pRVar7->instID[0] == 0xffffffff)) {
    pRVar7->instID[0] = prim->instID_;
    pRVar7->instPrimID[0] = uVar4;
    uVar11 = (ulong)prim->primID_;
    plVar8 = *(long **)&pGVar6[1].fnumTimeSegments;
    iVar5 = (int)plVar8[4];
    if ((pGVar6->field_8).field_0x1 == '\x01') {
      if (iVar5 == 0x9134) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),*(undefined4 *)(lVar9 + 0x10 + lVar12)
                           ,0x1c);
        in_XMM0 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
        auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                           *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
        in_XMM12 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
        auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                           *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
        in_XMM11 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
        auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                           *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
        in_XMM1 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
      }
      else if (iVar5 == 0x9234) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        uVar1 = *(undefined8 *)(lVar9 + 4 + lVar12);
        in_XMM0._4_4_ = (float)(int)uVar1;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar9 + lVar12);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar1 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
        in_XMM12._4_4_ = (int)uVar1;
        in_XMM12._0_4_ = *(undefined4 *)(lVar9 + 0xc + lVar12);
        in_XMM12._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM12._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
        in_XMM11._4_4_ = (int)uVar1;
        in_XMM11._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
        in_XMM11._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM11._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
        in_XMM1._4_4_ = (int)uVar1;
        in_XMM1._0_4_ = *(undefined4 *)(lVar9 + 0x24 + lVar12);
        in_XMM1._8_4_ = (int)((ulong)uVar1 >> 0x20);
        in_XMM1._12_4_ = 0;
      }
      else if (iVar5 == 0xb001) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
        auVar50 = insertps(auVar50,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
        uVar1 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
        auVar15._4_4_ = (int)uVar1;
        auVar15._0_4_ = *(undefined4 *)(lVar9 + lVar12);
        auVar15._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar15._12_4_ = 0;
        uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
        auVar29._4_4_ = (int)uVar1;
        auVar29._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
        auVar29._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar29._12_4_ = 0;
        fVar13 = *(float *)(lVar9 + 0x24 + lVar12);
        fVar26 = *(float *)(lVar9 + 0x28 + lVar12);
        fVar32 = *(float *)(lVar9 + 0x2c + lVar12);
        fVar19 = *(float *)(lVar9 + 0x30 + lVar12);
        fVar35 = fVar19 * fVar19 + fVar32 * fVar32 + fVar13 * fVar13 + fVar26 * fVar26;
        auVar25 = rsqrtss(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
        fVar20 = auVar25._0_4_;
        fVar20 = fVar20 * fVar20 * fVar35 * -0.5 * fVar20 + fVar20 * 1.5;
        in_XMM1 = insertps(auVar29,ZEXT416((uint)(fVar13 * fVar20)),0x30);
        in_XMM0 = insertps(auVar15,ZEXT416((uint)(fVar26 * fVar20)),0x30);
        auVar25._0_4_ = fVar20 * fVar19;
        auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                           *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
        in_XMM11 = insertps(auVar50,auVar25,0x30);
        auVar15 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
        in_XMM12 = insertps(auVar15,ZEXT416((uint)(fVar32 * fVar20)),0x30);
      }
      else if (iVar5 == 0x9244) {
        lVar9 = *plVar8;
        lVar12 = uVar11 * plVar8[2];
        in_XMM0 = *(undefined1 (*) [16])(lVar9 + lVar12);
        in_XMM12 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
        in_XMM11 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
        in_XMM1 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar12);
      }
      fVar32 = in_XMM1._12_4_;
      fVar13 = in_XMM0._0_4_;
      fVar26 = in_XMM0._12_4_;
      fVar42 = in_XMM12._0_4_;
      fVar44 = in_XMM12._4_4_;
      fVar41 = in_XMM12._12_4_;
      fVar37 = in_XMM11._0_4_;
      fVar39 = in_XMM11._4_4_;
      fVar40 = in_XMM11._8_4_;
      fVar36 = in_XMM11._12_4_;
      fVar35 = fVar26 * fVar41 + fVar36 * fVar32;
      fVar19 = fVar26 * fVar41 - fVar36 * fVar32;
      fVar20 = fVar32 * fVar32 + fVar26 * fVar26 + -fVar41 * fVar41 + -fVar36 * fVar36;
      fVar52 = fVar32 * fVar32 - fVar26 * fVar26;
      fVar49 = fVar41 * fVar41 + fVar52 + -fVar36 * fVar36;
      fVar53 = fVar26 * fVar36 - fVar41 * fVar32;
      fVar38 = fVar41 * fVar32 + fVar26 * fVar36;
      fVar51 = fVar41 * fVar36 + fVar26 * fVar32;
      fVar26 = fVar41 * fVar36 - fVar26 * fVar32;
      fVar35 = fVar35 + fVar35;
      fVar53 = fVar53 + fVar53;
      fVar32 = fVar36 * fVar36 + fVar52 + -fVar41 * fVar41;
      fVar52 = fVar20 * 1.0 + fVar35 * 0.0 + fVar53 * 0.0;
      fVar45 = fVar20 * 0.0 + fVar35 * 1.0 + fVar53 * 0.0;
      fVar47 = fVar20 * 0.0 + fVar35 * 0.0 + fVar53 * 1.0;
      fVar53 = fVar20 * 0.0 + fVar35 * 0.0 + fVar53 * 0.0;
      fVar51 = fVar51 + fVar51;
      fVar19 = fVar19 + fVar19;
      fVar20 = fVar19 * 1.0 + fVar49 * 0.0 + fVar51 * 0.0;
      fVar35 = fVar19 * 0.0 + fVar49 * 1.0 + fVar51 * 0.0;
      fVar36 = fVar19 * 0.0 + fVar49 * 0.0 + fVar51 * 1.0;
      fVar19 = fVar19 * 0.0 + fVar49 * 0.0 + fVar51 * 0.0;
      auVar48._0_8_ = in_XMM0._4_8_;
      auVar48._8_8_ = 0;
      auVar15 = blendps(auVar48,in_XMM12,4);
      fVar38 = fVar38 + fVar38;
      fVar26 = fVar26 + fVar26;
      fVar49 = fVar38 * 1.0 + fVar26 * 0.0 + fVar32 * 0.0;
      fVar51 = fVar38 * 0.0 + fVar26 * 1.0 + fVar32 * 0.0;
      fVar41 = fVar38 * 0.0 + fVar26 * 0.0 + fVar32 * 1.0;
      fVar32 = fVar38 * 0.0 + fVar26 * 0.0 + fVar32 * 0.0;
      local_48._0_4_ = in_XMM1._0_4_;
      local_48._4_4_ = in_XMM1._4_4_;
      uStack_40._0_4_ = in_XMM1._8_4_;
      fVar26 = fVar32 * 0.0;
      in_XMM0._0_4_ = fVar13 * fVar52 + fVar20 * 0.0 + fVar49 * 0.0;
      in_XMM0._4_4_ = fVar13 * fVar45 + fVar35 * 0.0 + fVar51 * 0.0;
      in_XMM0._8_4_ = fVar13 * fVar47 + fVar36 * 0.0 + fVar41 * 0.0;
      in_XMM0._12_4_ = fVar13 * fVar53 + fVar19 * 0.0 + fVar26;
      in_XMM7._0_4_ = fVar42 * fVar52 + fVar44 * fVar20 + fVar49 * 0.0;
      in_XMM7._4_4_ = fVar42 * fVar45 + fVar44 * fVar35 + fVar51 * 0.0;
      in_XMM7._8_4_ = fVar42 * fVar47 + fVar44 * fVar36 + fVar41 * 0.0;
      in_XMM7._12_4_ = fVar42 * fVar53 + fVar44 * fVar19 + fVar26;
      in_XMM4._0_4_ = fVar37 * fVar52 + fVar39 * fVar20 + fVar40 * fVar49;
      in_XMM4._4_4_ = fVar37 * fVar45 + fVar39 * fVar35 + fVar40 * fVar51;
      in_XMM4._8_4_ = fVar37 * fVar47 + fVar39 * fVar36 + fVar40 * fVar41;
      in_XMM4._12_4_ = fVar37 * fVar53 + fVar39 * fVar19 + fVar40 * fVar32;
      auVar33._0_4_ =
           (float)local_48 * fVar52 + local_48._4_4_ * fVar20 + (float)uStack_40 * fVar49 +
           auVar15._0_4_ + 0.0;
      auVar33._4_4_ =
           (float)local_48 * fVar45 + local_48._4_4_ * fVar35 + (float)uStack_40 * fVar51 +
           auVar15._4_4_ + 0.0;
      auVar33._8_4_ =
           (float)local_48 * fVar47 + local_48._4_4_ * fVar36 + (float)uStack_40 * fVar41 +
           auVar15._8_4_ + 0.0;
    }
    else if (iVar5 == 0x9134) {
      lVar9 = *plVar8;
      lVar12 = uVar11 * plVar8[2];
      auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + lVar12)),*(undefined4 *)(lVar9 + 0x10 + lVar12),
                         0x1c);
      in_XMM0 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x20 + lVar12),0x28);
      auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + 4 + lVar12)),
                         *(undefined4 *)(lVar9 + 0x14 + lVar12),0x1c);
      in_XMM7 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x24 + lVar12),0x28);
      auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + 8 + lVar12)),
                         *(undefined4 *)(lVar9 + 0x18 + lVar12),0x1c);
      in_XMM4 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x28 + lVar12),0x28);
      auVar15 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                         *(undefined4 *)(lVar9 + 0x1c + lVar12),0x1c);
      auVar15 = insertps(auVar15,*(undefined4 *)(lVar9 + 0x2c + lVar12),0x28);
      auVar33 = auVar15._0_12_;
    }
    else if (iVar5 == 0x9234) {
      lVar9 = *plVar8;
      lVar12 = uVar11 * plVar8[2];
      uVar1 = *(undefined8 *)(lVar9 + 4 + lVar12);
      in_XMM0._4_4_ = (float)(int)uVar1;
      in_XMM0._0_4_ = (float)*(undefined4 *)(lVar9 + lVar12);
      in_XMM0._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM0._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar9 + 0x10 + lVar12);
      in_XMM7._4_4_ = (float)(int)uVar1;
      in_XMM7._0_4_ = (float)*(undefined4 *)(lVar9 + 0xc + lVar12);
      in_XMM7._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM7._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
      in_XMM4._4_4_ = (float)(int)uVar1;
      in_XMM4._0_4_ = (float)*(undefined4 *)(lVar9 + 0x18 + lVar12);
      in_XMM4._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
      in_XMM4._12_4_ = 0.0;
      uVar1 = *(undefined8 *)(lVar9 + 0x28 + lVar12);
      auVar33._4_4_ = (float)(int)uVar1;
      auVar33._0_4_ = (float)*(undefined4 *)(lVar9 + 0x24 + lVar12);
      auVar33._8_4_ = (float)(int)((ulong)uVar1 >> 0x20);
    }
    else if (iVar5 == 0xb001) {
      lVar9 = *plVar8;
      lVar12 = uVar11 * plVar8[2];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar12);
      auVar15 = insertps(auVar27,*(undefined4 *)(lVar9 + 8 + lVar12),0x20);
      uVar1 = *(undefined8 *)(lVar9 + 0x34 + lVar12);
      auVar14._4_4_ = (int)uVar1;
      auVar14._0_4_ = *(undefined4 *)(lVar9 + lVar12);
      auVar14._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar14._12_4_ = 0;
      uVar1 = *(undefined8 *)(lVar9 + 0x1c + lVar12);
      auVar34._4_4_ = (int)uVar1;
      auVar34._0_4_ = *(undefined4 *)(lVar9 + 0x18 + lVar12);
      auVar34._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar34._12_4_ = 0;
      fVar13 = *(float *)(lVar9 + 0x24 + lVar12);
      fVar26 = *(float *)(lVar9 + 0x28 + lVar12);
      fVar32 = *(float *)(lVar9 + 0x2c + lVar12);
      fVar19 = *(float *)(lVar9 + 0x30 + lVar12);
      fVar35 = fVar19 * fVar19 + fVar32 * fVar32 + fVar13 * fVar13 + fVar26 * fVar26;
      auVar29 = rsqrtss(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar20 = auVar29._0_4_;
      auVar43._4_12_ = auVar29._4_12_;
      fVar20 = fVar20 * fVar20 * fVar35 * -0.5 * fVar20 + fVar20 * 1.5;
      auVar29 = insertps(auVar34,ZEXT416((uint)(fVar13 * fVar20)),0x30);
      auVar33 = auVar29._0_12_;
      in_XMM0 = insertps(auVar14,ZEXT416((uint)(fVar26 * fVar20)),0x30);
      auVar43._0_4_ = fVar20 * fVar19;
      auVar29 = insertps(ZEXT416(*(uint *)(lVar9 + 0xc + lVar12)),
                         *(undefined4 *)(lVar9 + 4 + lVar12),0x10);
      in_XMM4 = insertps(auVar15,auVar43,0x30);
      auVar15 = insertps(auVar29,*(undefined4 *)(lVar9 + 0x3c + lVar12),0x20);
      in_XMM7 = insertps(auVar15,ZEXT416((uint)(fVar32 * fVar20)),0x30);
    }
    else if (iVar5 == 0x9244) {
      lVar9 = *plVar8;
      lVar12 = uVar11 * plVar8[2];
      in_XMM0 = *(undefined1 (*) [16])(lVar9 + lVar12);
      in_XMM7 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar12);
      in_XMM4 = *(undefined1 (*) [16])(lVar9 + 0x20 + lVar12);
      auVar33 = SUB1612(*(undefined1 (*) [16])(lVar9 + 0x30 + lVar12),0);
    }
    fVar35 = in_XMM4._0_4_;
    fVar36 = in_XMM4._4_4_;
    fVar38 = in_XMM4._8_4_;
    fVar49 = in_XMM4._12_4_;
    fVar51 = in_XMM7._0_4_;
    fVar41 = in_XMM7._4_4_;
    fVar52 = in_XMM7._8_4_;
    fVar13 = in_XMM0._0_4_;
    fVar26 = in_XMM0._4_4_;
    fVar32 = in_XMM0._8_4_;
    auVar18._0_4_ = fVar51 * fVar36 - fVar41 * fVar35;
    fVar19 = fVar41 * fVar38 - fVar52 * fVar36;
    fVar20 = fVar52 * fVar35 - fVar51 * fVar38;
    auVar21._4_4_ = fVar20;
    auVar21._0_4_ = fVar19;
    auVar21._8_4_ = auVar18._0_4_;
    auVar21._12_4_ = in_XMM7._12_4_ * fVar49 - in_XMM7._12_4_ * fVar49;
    auVar28._0_4_ = fVar35 * fVar26 - fVar36 * fVar13;
    auVar28._4_4_ = fVar36 * fVar32 - fVar38 * fVar26;
    auVar28._8_4_ = fVar38 * fVar13 - fVar35 * fVar32;
    auVar28._12_4_ = fVar49 * in_XMM0._12_4_ - fVar49 * in_XMM0._12_4_;
    auVar15 = dpps(in_XMM0,auVar21,0x7f);
    fVar35 = fVar26 * fVar52 - fVar32 * fVar41;
    auVar29 = insertps(auVar28,auVar28,0x4a);
    auVar18._4_4_ = auVar28._0_4_;
    auVar18._8_4_ = fVar13 * fVar41 - fVar26 * fVar51;
    auVar18._12_4_ = 0;
    auVar24._4_4_ = fVar35;
    auVar24._0_4_ = fVar19;
    auVar24._8_4_ = fVar35;
    auVar24._12_4_ = auVar29._4_4_;
    auVar23._8_8_ = auVar24._8_8_;
    auVar23._4_4_ = auVar29._0_4_;
    auVar23._0_4_ = fVar19;
    auVar22._4_4_ = auVar29._8_4_;
    auVar22._0_4_ = fVar20;
    auVar22._8_4_ = fVar32 * fVar51 - fVar13 * fVar52;
    auVar22._12_4_ = auVar29._12_4_;
    auVar16._0_4_ = auVar15._0_4_;
    auVar16._4_4_ = auVar16._0_4_;
    auVar16._8_4_ = auVar16._0_4_;
    auVar16._12_4_ = auVar16._0_4_;
    auVar25 = divps(auVar23,auVar16);
    auVar29 = divps(auVar22,auVar16);
    auVar15 = divps(auVar18,auVar16);
    fVar45 = auVar33._0_4_;
    fVar47 = auVar33._4_4_;
    fVar53 = auVar33._8_4_;
    fVar13 = auVar15._0_4_;
    fVar26 = auVar15._4_4_;
    fVar32 = auVar15._8_4_;
    fVar19 = auVar15._12_4_;
    fVar20 = auVar29._0_4_;
    fVar35 = auVar29._4_4_;
    fVar36 = auVar29._8_4_;
    fVar38 = auVar29._12_4_;
    fVar49 = auVar25._0_4_;
    fVar51 = auVar25._4_4_;
    fVar41 = auVar25._8_4_;
    fVar52 = auVar25._12_4_;
    aVar2 = (ray->super_RayK<1>).org.field_0.field_1;
    fVar37 = aVar2.x;
    fVar39 = aVar2.y;
    fVar40 = aVar2.z;
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar42 = aVar3.x;
    fVar44 = aVar3.y;
    fVar46 = aVar3.z;
    auVar30._0_4_ =
         fVar37 * fVar49 +
         fVar39 * fVar20 + (fVar40 * fVar13 - (fVar45 * fVar49 + fVar47 * fVar20 + fVar53 * fVar13))
    ;
    auVar30._4_4_ =
         fVar37 * fVar51 +
         fVar39 * fVar35 + (fVar40 * fVar26 - (fVar45 * fVar51 + fVar47 * fVar35 + fVar53 * fVar26))
    ;
    auVar30._8_4_ =
         fVar37 * fVar41 +
         fVar39 * fVar36 + (fVar40 * fVar32 - (fVar45 * fVar41 + fVar47 * fVar36 + fVar53 * fVar32))
    ;
    auVar30._12_4_ =
         fVar37 * fVar52 +
         fVar39 * fVar38 + (fVar40 * fVar19 - (fVar45 * fVar52 + fVar47 * fVar38 + fVar53 * fVar19))
    ;
    aVar31.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar30,aVar2,8);
    (ray->super_RayK<1>).org.field_0 = aVar31;
    auVar17._0_4_ = fVar42 * fVar49 + fVar44 * fVar20 + fVar46 * fVar13;
    auVar17._4_4_ = fVar42 * fVar51 + fVar44 * fVar35 + fVar46 * fVar26;
    auVar17._8_4_ = fVar42 * fVar41 + fVar44 * fVar36 + fVar46 * fVar32;
    auVar17._12_4_ = fVar42 * fVar52 + fVar44 * fVar38 + fVar46 * fVar19;
    aVar31.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar17,aVar3,8);
    (ray->super_RayK<1>).dir.field_0 = aVar31;
    (**(code **)(p_Var10 + 0x78))(p_Var10 + 0x58,ray);
    local_48 = aVar2._0_8_;
    uStack_40 = aVar2._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_48;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_40;
    local_38 = aVar3._0_8_;
    uStack_30 = aVar3._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = local_38;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_30;
    pRVar7->instID[0] = 0xffffffff;
    pRVar7->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif

      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }